

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxy::~IfcBuildingElementProxy
          (IfcBuildingElementProxy *this)

{
  *(undefined8 *)&this[-1].field_0x50 = 0x936908;
  *(undefined8 *)&this->field_0x38 = 0x936a20;
  *(undefined8 *)&this[-1].field_0xd8 = 0x936930;
  *(undefined8 *)&this[-1].field_0xe8 = 0x936958;
  *(undefined8 *)&this[-1].field_0x120 = 0x936980;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x9369a8;
  *(undefined8 *)&this[-1].field_0x188 = 0x9369d0;
  *(undefined8 *)this = 0x9369f8;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x50,&PTR_construction_vtable_24__00936a40);
  operator_delete(&this[-1].field_0x50);
  return;
}

Assistant:

IfcBuildingElementProxy() : Object("IfcBuildingElementProxy") {}